

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

void print_statdiffr(char *prefix,char *fmt,long oldv,long newv)

{
  undefined8 in_RAX;
  attr_t attr;
  wchar_t col;
  
  _attr = in_RAX;
  waddnstr(statuswin," ",0xffffffffffffffff);
  status_change_color_on(&col,&attr,-(long)fmt,0,-oldv,0);
  wprintw(statuswin,prefix,oldv);
  status_change_color_off(col,attr);
  return;
}

Assistant:

static void print_statdiffr(const char *prefix, const char *fmt,
			    long oldv, long newv)
{
    int col;
    attr_t attr;

    if (prefix && prefix[0])
	waddstr(statuswin, prefix);
    status_change_color_on(&col, &attr, -oldv, 0, -newv, 0);
    wprintw(statuswin, fmt, newv);
    status_change_color_off(col, attr);
}